

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loadable_extension_demo.cpp
# Opt level: O0

void QuackFunction::QuackFunc(ClientContext *context,TableFunctionInput *data_p,DataChunk *output)

{
  DataChunk *pDVar1;
  DataChunk *in_RDX;
  idx_t count;
  QuackGlobalData *data;
  QuackBindData *bind_data;
  optional_ptr<duckdb::GlobalTableFunctionState,_true> *in_stack_ffffffffffffff70;
  Value *pVVar2;
  Value local_70 [64];
  Value *local_30;
  GlobalTableFunctionState *local_28;
  QuackBindData *local_20;
  DataChunk *local_18;
  
  local_18 = in_RDX;
  duckdb::optional_ptr<const_duckdb::FunctionData,_true>::operator->
            ((optional_ptr<const_duckdb::FunctionData,_true> *)in_stack_ffffffffffffff70);
  local_20 = duckdb::FunctionData::Cast<QuackFunction::QuackBindData>
                       ((FunctionData *)in_stack_ffffffffffffff70);
  local_28 = duckdb::optional_ptr<duckdb::GlobalTableFunctionState,_true>::operator*
                       (in_stack_ffffffffffffff70);
  if (*(ulong *)(local_28 + 8) < local_20->number_of_quacks) {
    for (local_30 = (Value *)0x0; pDVar1 = local_18,
        *(ulong *)(local_28 + 8) < local_20->number_of_quacks && local_30 < (Value *)0x800;
        local_30 = local_30 + 1) {
      pVVar2 = local_30;
      duckdb::Value::Value(local_70,"QUACK");
      duckdb::DataChunk::SetValue((ulong)pDVar1,0,pVVar2);
      duckdb::Value::~Value(local_70);
      *(long *)(local_28 + 8) = *(long *)(local_28 + 8) + 1;
    }
    duckdb::DataChunk::SetCardinality(local_18,(idx_t)local_30);
  }
  return;
}

Assistant:

static void QuackFunc(ClientContext &context, TableFunctionInput &data_p, DataChunk &output) {
		auto &bind_data = data_p.bind_data->Cast<QuackBindData>();
		auto &data = (QuackGlobalData &)*data_p.global_state;
		if (data.offset >= bind_data.number_of_quacks) {
			// finished returning values
			return;
		}
		// start returning values
		// either fill up the chunk or return all the remaining columns
		idx_t count = 0;
		while (data.offset < bind_data.number_of_quacks && count < STANDARD_VECTOR_SIZE) {
			output.SetValue(0, count, Value("QUACK"));
			data.offset++;
			count++;
		}
		output.SetCardinality(count);
	}